

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCtorsPass.cpp
# Opt level: O2

PreservedAnalyses * __thiscall
InlineCtorsPass::run
          (PreservedAnalyses *__return_storage_ptr__,InlineCtorsPass *this,Function *F,
          FunctionAnalysisManager *FM)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  void *pvVar4;
  uint uVar5;
  char cVar6;
  bool bVar7;
  GlobalVariable *Tors;
  GlobalVariable *Tors_00;
  undefined8 *puVar8;
  ilist_node_base<false> **ppiVar9;
  long lVar10;
  ulong uVar11;
  Module *this_00;
  Twine *pTVar12;
  pair<llvm::Function_*,_unsigned_long> *__i;
  long lVar13;
  StringRef SVar14;
  StringRef Name;
  StringRef Name_00;
  Function *InsertBefore;
  inst_iterator I;
  FunctionCallee local_130;
  FunctionCallee local_120;
  SmallVector<std::pair<llvm::Function_*,_unsigned_long>,_4U> Ctors;
  inst_iterator E;
  SmallVector<std::pair<llvm::Function_*,_unsigned_long>,_4U> Dtors;
  Twine local_58;
  
  SVar14.Length = (size_t)"shellvm-main";
  SVar14.Data = (char *)F;
  cVar6 = llvm::Function::hasFnAttribute(SVar14);
  if (cVar6 != '\0') {
    Name.Length = 0x11;
    Name.Data = "llvm.global_ctors";
    Tors = llvm::Module::getNamedGlobal(*(Module **)(F + 0x28),Name);
    this_00 = *(Module **)(F + 0x28);
    Name_00.Length = 0x11;
    Name_00.Data = "llvm.global_dtors";
    Tors_00 = llvm::Module::getNamedGlobal(this_00,Name_00);
    if (Tors != (GlobalVariable *)0x0 || Tors_00 != (GlobalVariable *)0x0) {
      Ctors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
      super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
      super_SmallVectorBase<unsigned_int>.BeginX =
           &Ctors.super_SmallVectorStorage<std::pair<llvm::Function_*,_unsigned_long>,_4U>;
      Ctors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
      super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
      super_SmallVectorBase<unsigned_int>.Size = 0;
      Ctors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
      super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
      super_SmallVectorBase<unsigned_int>.Capacity = 4;
      getFunctions((InlineCtorsPass *)this_00,Tors,
                   &Ctors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>);
      Dtors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
      super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
      super_SmallVectorBase<unsigned_int>.BeginX =
           &Dtors.super_SmallVectorStorage<std::pair<llvm::Function_*,_unsigned_long>,_4U>;
      Dtors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
      super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
      super_SmallVectorBase<unsigned_int>.Size = 0;
      Dtors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
      super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
      super_SmallVectorBase<unsigned_int>.Capacity = 4;
      getFunctions((InlineCtorsPass *)this_00,Tors_00,
                   &Dtors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>);
      pvVar4 = Ctors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
               super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
               super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
               super_SmallVectorBase<unsigned_int>.BeginX;
      uVar5 = Ctors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
              super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
              super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
              super_SmallVectorBase<unsigned_int>.Size;
      uVar11 = Ctors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
               super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
               super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
               super_SmallVectorBase<unsigned_int>._8_8_ & 0xffffffff;
      if (uVar11 != 0) {
        pvVar1 = (void *)((long)Ctors.
                                super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
                                super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>
                                .
                                super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                                .super_SmallVectorBase<unsigned_int>.BeginX + uVar11 * 0x10);
        lVar13 = 0x3f;
        if (uVar11 != 0) {
          for (; Ctors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
                 super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                 super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
                 super_SmallVectorBase<unsigned_int>.Size >> lVar13 == 0; lVar13 = lVar13 + -1) {
          }
        }
        std::
        __introsort_loop<std::pair<llvm::Function*,unsigned_long>*,long,__gnu_cxx::__ops::_Iter_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__0>>
                  (Ctors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
                   super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                   super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                   .super_SmallVectorBase<unsigned_int>.BeginX,pvVar1,
                   ((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
        if (uVar5 < 0x11) {
          std::
          __insertion_sort<std::pair<llvm::Function*,unsigned_long>*,__gnu_cxx::__ops::_Iter_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__0>>
                    (pvVar4,pvVar1);
        }
        else {
          lVar13 = (long)pvVar4 + 0x100;
          std::
          __insertion_sort<std::pair<llvm::Function*,unsigned_long>*,__gnu_cxx::__ops::_Iter_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__0>>
                    (pvVar4,lVar13);
          for (lVar10 = uVar11 * 0x10 + -0x100; lVar10 != 0; lVar10 = lVar10 + -0x10) {
            std::
            __unguarded_linear_insert<std::pair<llvm::Function*,unsigned_long>*,__gnu_cxx::__ops::_Val_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__0>>
                      (lVar13);
            lVar13 = lVar13 + 0x10;
          }
        }
        pvVar4 = Ctors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
                 super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                 super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
                 super_SmallVectorBase<unsigned_int>.BeginX;
        uVar5 = Ctors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
                super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
                super_SmallVectorBase<unsigned_int>.Size;
        uVar11 = Ctors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
                 super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                 super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
                 super_SmallVectorBase<unsigned_int>._8_8_ & 0xffffffff;
        if (uVar11 != 0) {
          pvVar1 = (void *)((long)Ctors.
                                  super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>
                                  .
                                  super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>
                                  .
                                  super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                                  .super_SmallVectorBase<unsigned_int>.BeginX + uVar11 * 0x10);
          lVar13 = 0x3f;
          if (uVar11 != 0) {
            for (; Ctors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
                   super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                   super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                   .super_SmallVectorBase<unsigned_int>.Size >> lVar13 == 0; lVar13 = lVar13 + -1) {
            }
          }
          std::
          __introsort_loop<std::pair<llvm::Function*,unsigned_long>*,long,__gnu_cxx::__ops::_Iter_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__1>>
                    (Ctors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
                     super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>
                     .
                     super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                     .super_SmallVectorBase<unsigned_int>.BeginX,pvVar1,
                     ((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
          if (uVar5 < 0x11) {
            std::
            __insertion_sort<std::pair<llvm::Function*,unsigned_long>*,__gnu_cxx::__ops::_Iter_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__1>>
                      (pvVar4,pvVar1);
          }
          else {
            lVar13 = (long)pvVar4 + 0x100;
            std::
            __insertion_sort<std::pair<llvm::Function*,unsigned_long>*,__gnu_cxx::__ops::_Iter_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__1>>
                      (pvVar4,lVar13);
            for (lVar10 = uVar11 * 0x10 + -0x100; lVar10 != 0; lVar10 = lVar10 + -0x10) {
              std::
              __unguarded_linear_insert<std::pair<llvm::Function*,unsigned_long>*,__gnu_cxx::__ops::_Val_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__1>>
                        (lVar13);
              lVar13 = lVar13 + 0x10;
            }
          }
        }
      }
      lVar13 = *(long *)(F + 0x50) + -0x18;
      if (*(long *)(F + 0x50) == 0) {
        lVar13 = 0;
      }
      puVar8 = (undefined8 *)(lVar13 + 0x30);
      while( true ) {
        I.BBs = (SymbolTableList<llvm::BasicBlock> *)*puVar8;
        bVar7 = llvm::
                isa_impl_wrap<llvm::AllocaInst,_const_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction_*>
                ::doit((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                        *)&I);
        pvVar4 = Ctors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
                 super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                 super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
                 super_SmallVectorBase<unsigned_int>.BeginX;
        if (!bVar7) break;
        puVar8 = (undefined8 *)&(I.BBs)->field_0x8;
      }
      uVar11 = Ctors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
               super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
               super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
               super_SmallVectorBase<unsigned_int>._8_8_ & 0xffffffff;
      for (lVar13 = 0; uVar11 << 4 != lVar13; lVar13 = lVar13 + 0x10) {
        llvm::FunctionCallee::
        FunctionCallee<llvm::Function,llvm::FunctionType*(llvm::Function::*)()const>
                  (&local_120,*(Function **)((long)pvVar4 + lVar13));
        llvm::Twine::Twine(&local_58,"");
        pTVar12 = (Twine *)&I.BBs[-2].field_0x8;
        if (I.BBs == (SymbolTableList<llvm::BasicBlock> *)0x0) {
          pTVar12 = (Twine *)0x0;
        }
        auVar2._8_8_ = 0;
        auVar2._0_8_ = &local_58;
        llvm::CallInst::Create
                  ((CallInst *)local_120.FnTy,(FunctionType *)local_120.Callee,(Value *)0x0,
                   (ArrayRef<llvm::Value_*>)(auVar2 << 0x40),pTVar12,(Instruction *)F);
      }
      InsertBefore = F;
      llvm::
      InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
      ::InstIterator<llvm::Function>(&I,F);
      E.BBs = (SymbolTableList<llvm::BasicBlock> *)(F + 0x48);
      E.BI.NodePtr = (node_pointer)0x0;
      E.BB.NodePtr = (node_pointer)E.BBs;
      while (bVar7 = llvm::
                     InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                     ::operator!=(&I,&E),
            pvVar4 = Dtors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
                     super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>
                     .
                     super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                     .super_SmallVectorBase<unsigned_int>.BeginX, bVar7) {
        ppiVar9 = &I.BI.NodePtr[-2].super_node_base_type.Next;
        if (I.BI.NodePtr == (node_pointer)0x0) {
          ppiVar9 = (ilist_node_base<false> **)0x0;
        }
        if (*(char *)(ppiVar9 + 2) == '\x1c') {
          uVar11 = Dtors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>.
                   super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                   super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                   .super_SmallVectorBase<unsigned_int>._8_8_ & 0xffffffff;
          for (lVar13 = 0; uVar11 << 4 != lVar13; lVar13 = lVar13 + 0x10) {
            llvm::FunctionCallee::
            FunctionCallee<llvm::Function,llvm::FunctionType*(llvm::Function::*)()const>
                      (&local_130,*(Function **)((long)pvVar4 + lVar13));
            llvm::Twine::Twine(&local_58,"");
            pTVar12 = (Twine *)&I.BI.NodePtr[-2].super_node_base_type.Next;
            if (I.BI.NodePtr == (node_pointer)0x0) {
              pTVar12 = (Twine *)0x0;
            }
            auVar3._8_8_ = 0;
            auVar3._0_8_ = &local_58;
            llvm::CallInst::Create
                      ((CallInst *)local_130.FnTy,(FunctionType *)local_130.Callee,(Value *)0x0,
                       (ArrayRef<llvm::Value_*>)(auVar3 << 0x40),pTVar12,(Instruction *)InsertBefore
                      );
          }
        }
        llvm::
        InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
        ::operator++(&I);
      }
      if (Tors != (GlobalVariable *)0x0) {
        llvm::GlobalVariable::removeFromParent();
      }
      if (Tors_00 != (GlobalVariable *)0x0) {
        llvm::GlobalVariable::removeFromParent();
      }
      llvm::PreservedAnalyses::none();
      llvm::SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>::~SmallVectorImpl
                (&Dtors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>);
      llvm::SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>::~SmallVectorImpl
                (&Ctors.super_SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_>);
      return __return_storage_ptr__;
    }
  }
  llvm::PreservedAnalyses::all();
  return __return_storage_ptr__;
}

Assistant:

llvm::PreservedAnalyses InlineCtorsPass::run(Function &F,
                                             FunctionAnalysisManager &FM) {
  if (!F.hasFnAttribute("shellvm-main")) {

    return llvm::PreservedAnalyses::all();
  }

  GlobalVariable *GlobalCtors =
      F.getParent()->getNamedGlobal("llvm.global_ctors");
  GlobalVariable *GlobalDtors =
      F.getParent()->getNamedGlobal("llvm.global_dtors");
  if (!GlobalCtors && !GlobalDtors) {
    return llvm::PreservedAnalyses::all();
  }

  SmallVector<FunctionPair, 4> Ctors;
  getFunctions(GlobalCtors, Ctors);
  SmallVector<FunctionPair, 4> Dtors;
  getFunctions(GlobalDtors, Dtors);

  // Sort constructors in ascending order of priority
  std::sort(Ctors.begin(), Ctors.end(),
            [](const FunctionPair &A, const FunctionPair &B) -> bool {
              return A.second > B.second;
            });

  // Sort destructors in descending order of priority
  std::sort(Ctors.begin(), Ctors.end(),
            [](const FunctionPair &A, const FunctionPair &B) -> bool {
              return A.second < B.second;
            });

  {
    BasicBlock *BBEntry = &F.getEntryBlock();
    BasicBlock::iterator I = BBEntry->begin();
    // Place calls to constructors after alloca
    while (isa<AllocaInst>(I))
      ++I;

    for (auto &KV : Ctors) {
      CallInst::Create(KV.first, ArrayRef<Value *>(), "", &*I);
    }
  }

  // Search for ret instructions
  for (inst_iterator I = inst_begin(F), E = inst_end(F); I != E; ++I) {
    if (!isa<ReturnInst>(*I)) {
      continue;
    }

    for (auto &KV : Dtors) {
      CallInst::Create(KV.first, ArrayRef<Value *>(), "", &*I);
    }
  }

  // Delete llvm.global_ctors and llvm.global_dtors to prevent duplicate calls
  if (GlobalCtors)
    GlobalCtors->removeFromParent();
  if (GlobalDtors)
    GlobalDtors->removeFromParent();

  return llvm::PreservedAnalyses::none();
}